

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O2

void mqc_byteout(opj_mqc_t *mqc)

{
  uchar *puVar1;
  uchar uVar2;
  uint uVar3;
  uint uVar4;
  
  puVar1 = mqc->bp;
  if (*puVar1 == 0xff) {
    puVar1 = puVar1 + 1;
    mqc->bp = puVar1;
    uVar3 = mqc->c;
LAB_00138bb8:
    uVar2 = (uchar)(uVar3 >> 0x14);
    uVar3 = 7;
    uVar4 = 0xfffff;
  }
  else {
    uVar3 = mqc->c;
    if ((uVar3 >> 0x1b & 1) == 0) {
      puVar1 = puVar1 + 1;
      mqc->bp = puVar1;
    }
    else {
      *puVar1 = *puVar1 + '\x01';
      puVar1 = mqc->bp;
      if (*puVar1 == 0xff) {
        uVar3 = mqc->c & 0x7ffffff;
        mqc->c = uVar3;
        puVar1 = puVar1 + 1;
        mqc->bp = puVar1;
        goto LAB_00138bb8;
      }
      puVar1 = puVar1 + 1;
      mqc->bp = puVar1;
      uVar3 = mqc->c;
    }
    uVar2 = (uchar)(uVar3 >> 0x13);
    uVar3 = 8;
    uVar4 = 0x7ffff;
  }
  *puVar1 = uVar2;
  mqc->c = mqc->c & uVar4;
  mqc->ct = uVar3;
  return;
}

Assistant:

static void mqc_byteout(opj_mqc_t *mqc) {
	if (*mqc->bp == 0xff) {
		mqc->bp++;
		*mqc->bp = mqc->c >> 20;
		mqc->c &= 0xfffff;
		mqc->ct = 7;
	} else {
		if ((mqc->c & 0x8000000) == 0) {	/* ((mqc->c&0x8000000)==0) CHANGE */
			mqc->bp++;
			*mqc->bp = mqc->c >> 19;
			mqc->c &= 0x7ffff;
			mqc->ct = 8;
		} else {
			(*mqc->bp)++;
			if (*mqc->bp == 0xff) {
				mqc->c &= 0x7ffffff;
				mqc->bp++;
				*mqc->bp = mqc->c >> 20;
				mqc->c &= 0xfffff;
				mqc->ct = 7;
			} else {
				mqc->bp++;
				*mqc->bp = mqc->c >> 19;
				mqc->c &= 0x7ffff;
				mqc->ct = 8;
			}
		}
	}
}